

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

mipmapped_texture * __thiscall
crnlib::mipmapped_texture::operator=(mipmapped_texture *this,mipmapped_texture *rhs)

{
  face_vec *this_00;
  uint uVar1;
  uint uVar2;
  void *p;
  mip_level *rhs_00;
  mip_level *this_01;
  uint uVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (this != rhs) {
    clear(this);
    dynamic_string::set(&this->m_name,&rhs->m_name,0xffffffff);
    this->m_width = rhs->m_width;
    this->m_height = rhs->m_height;
    this->m_comp_flags = rhs->m_comp_flags;
    this->m_format = rhs->m_format;
    this_00 = &this->m_faces;
    uVar1 = (rhs->m_faces).m_size;
    uVar2 = (this->m_faces).m_size;
    uVar3 = uVar2 - uVar1;
    if (uVar3 != 0) {
      if (uVar2 < uVar1 || uVar3 == 0) {
        if ((this->m_faces).m_capacity < uVar1) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar1,uVar2 + 1 == uVar1,0x10,(object_mover)0x0,
                     false);
        }
        uVar2 = (this->m_faces).m_size;
        if (uVar1 != uVar2) {
          memset(this_00->m_p + uVar2,0,(ulong)(uVar1 - uVar2) << 4);
        }
      }
      else {
        pvVar4 = this_00->m_p;
        lVar5 = 0;
        do {
          p = *(void **)((long)&pvVar4[uVar1].m_p + lVar5);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar3 << 4 != lVar5);
      }
      (this->m_faces).m_size = uVar1;
    }
    if ((this->m_faces).m_size != 0) {
      uVar7 = 0;
      do {
        uVar1 = (rhs->m_faces).m_p[uVar7].m_size;
        uVar2 = this_00->m_p[uVar7].m_size;
        pvVar4 = this_00->m_p + uVar7;
        if (uVar2 != uVar1) {
          if (uVar2 <= uVar1) {
            if (pvVar4->m_capacity < uVar1) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pvVar4,uVar1,uVar2 + 1 == uVar1,8,(object_mover)0x0,
                         false);
            }
            memset(pvVar4->m_p + pvVar4->m_size,0,(ulong)(uVar1 - pvVar4->m_size) << 3);
          }
          pvVar4->m_size = uVar1;
        }
        pvVar4 = (rhs->m_faces).m_p;
        if (pvVar4[uVar7].m_size != 0) {
          uVar6 = 0;
          do {
            rhs_00 = pvVar4[uVar7].m_p[uVar6];
            this_01 = (mip_level *)crnlib_malloc(0x28);
            this_01->m_width = 0;
            this_01->m_height = 0;
            this_01->m_comp_flags = cDefaultCompFlags;
            *(undefined8 *)&this_01->m_format = 0;
            *(undefined8 *)((long)&this_01->m_pImage + 4) = 0;
            *(undefined8 *)((long)&this_01->m_pDXTImage + 4) = 0;
            mip_level::operator=(this_01,rhs_00);
            this_00->m_p[uVar7].m_p[uVar6] = this_01;
            uVar6 = uVar6 + 1;
            pvVar4 = (rhs->m_faces).m_p;
          } while (uVar6 < pvVar4[uVar7].m_size);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (this->m_faces).m_size);
    }
  }
  return this;
}

Assistant:

mipmapped_texture& mipmapped_texture::operator=(const mipmapped_texture& rhs) {
  if (this == &rhs)
    return *this;

  clear();

  m_name = rhs.m_name;
  m_width = rhs.m_width;
  m_height = rhs.m_height;

  m_comp_flags = rhs.m_comp_flags;
  m_format = rhs.m_format;

  m_faces.resize(rhs.m_faces.size());
  for (uint i = 0; i < m_faces.size(); i++) {
    m_faces[i].resize(rhs.m_faces[i].size());

    for (uint j = 0; j < rhs.m_faces[i].size(); j++)
      m_faces[i][j] = crnlib_new<mip_level>(*rhs.m_faces[i][j]);
  }

  CRNLIB_ASSERT((!is_valid()) || check());

  return *this;
}